

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KEncodersDecoders.h
# Opt level: O0

void __thiscall
KDIS::NetToDataType<unsigned_long_long>::SwapBytes(NetToDataType<unsigned_long_long> *this)

{
  ushort local_1e;
  ushort local_1c;
  ushort local_1a;
  NetToDataType<unsigned_long_long> aNStack_18 [2];
  KUINT16 i_1;
  KUINT16 j;
  KUINT16 i;
  KOCTET Temp [8];
  NetToDataType<unsigned_long_long> *this_local;
  
  Temp = (KOCTET  [8])this;
  for (local_1a = 0; local_1a < 8; local_1a = local_1a + 1) {
    aNStack_18[local_1a] = this[local_1a];
  }
  local_1c = 7;
  for (local_1e = 0; local_1e < 8; local_1e = local_1e + 1) {
    this[local_1e] = aNStack_18[local_1c];
    local_1c = local_1c - 1;
  }
  return;
}

Assistant:

void SwapBytes()
    {
        KOCTET Temp[sizeof( DataType )];

        // Copy Data To temp;
        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            Temp[i] = m_Octs[i];
        }

        // Now swap bytes
        KUINT16 j = ( sizeof( DataType ) ) - 1 ;

        for( KUINT16 i = 0; i < sizeof( DataType ); ++i )
        {
            m_Octs[i] = Temp[j];
            --j;
        }
    }